

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O2

void iDynTree::assertSpatialMotionAreEqual
               (SpatialMotionVector *f1,SpatialMotionVector *f2,double tol,string *file,int line)

{
  Vector6 ret_1;
  Vector6 ret;
  string local_a8;
  VectorFixSize<6U> local_88;
  VectorFixSize<6U> local_58;
  
  local_58.m_data[0] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[0];
  local_58.m_data[1] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[1];
  local_58.m_data[2] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2];
  local_58.m_data[3] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0];
  local_58.m_data[4] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[1];
  local_58.m_data[5] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[2];
  local_88.m_data[0] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[0];
  local_88.m_data[1] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[1];
  local_88.m_data[2] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2];
  local_88.m_data[3] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0];
  local_88.m_data[4] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[1];
  local_88.m_data[5] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[2];
  std::__cxx11::string::string((string *)&local_a8,(string *)file);
  assertVectorAreEqual<iDynTree::VectorFixSize<6u>,iDynTree::VectorFixSize<6u>>
            (&local_58,&local_88,tol,&local_a8,line);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void assertSpatialMotionAreEqual(const SpatialMotionVector& f1, const SpatialMotionVector& f2, double tol, std::string file, int line)
{
    Vector6 f1plain = f1.asVector();
    Vector6 f2plain = f2.asVector();
    assertVectorAreEqual(f1plain,f2plain,tol,file,line);
}